

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  bool suc;
  string x;
  vector<unsigned_char,_std::allocator<unsigned_char>_> res;
  Secp256K1 p;
  string key;
  char local_109;
  string local_108;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  undefined1 local_c8 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  Secp256K1 local_78;
  string local_40;
  char *local_20;
  allocator *local_18;
  
  std::__cxx11::string::string
            ((string *)&local_40,"f7c32876271e88dbb576d575170de7162aed93a398deec0f7fdb330bc3f49956",
             (allocator *)&local_78);
  Secp256K1::Secp256K1(&local_78,&local_40);
  poVar2 = std::operator<<((ostream *)&std::cout,"Private key: ");
  Secp256K1::privateKeyHex_abi_cxx11_(&local_108,&local_78);
  poVar2 = std::operator<<(poVar2,(string *)&local_108);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_108);
  poVar2 = std::operator<<((ostream *)&std::cout,"Public key: ");
  Secp256K1::publicKeyHex_abi_cxx11_(&local_108,&local_78);
  poVar2 = std::operator<<(poVar2,(string *)&local_108);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string
            ((string *)local_c8,
             "de7761f8874d23d4e8f3f26f321ade560556c23c8d7c7c8227bfefaa83f2c485b511d12037bd1e1f9730f5cc031784e895d263f557793215c2f401f3cc5cfe2f"
             ,(allocator *)&local_e8);
  Secp256K1::base16Decode(&local_108,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Secp256K1::Sign((tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> *)
                  local_c8,&local_78,(uint8_t *)local_108._M_dataplus._M_p);
  local_20 = &local_109;
  local_18 = (allocator *)&local_e8;
  std::tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&,bool&>::operator=
            ((tuple<std::vector<unsigned_char,std::allocator<unsigned_char>>&,bool&> *)&local_20,
             (tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> *)local_c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_c8 + 8));
  if (local_109 == '\x01') {
    std::operator<<((ostream *)&std::cout,"\nsignature success");
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
    Secp256K1::publicKey
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,&local_78);
    bVar1 = Secp256K1::Verify((uint8_t *)local_108._M_dataplus._M_p,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"\nVerified!!!\n");
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  Secp256K1::~Secp256K1(&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

int main()
{
    std::string key = "f7c32876271e88dbb576d575170de7162aed93a398deec0f7fdb330bc3f49956";
    Secp256K1 p { key };
    std::cout << "Private key: " << p.privateKeyHex() << std::endl;
    std::cout << "Public key: " << p.publicKeyHex() << std::endl;

    std::string x = Secp256K1::base16Decode("de7761f8874d23d4e8f3f26f321ade560556c23c8d7c7c8227bfefaa83f2c485b511d12037bd1e1f9730f5cc031784e895d263f557793215c2f401f3cc5cfe2f");
    std::vector<uint8_t> res;

    bool suc;
    std::tie(res, suc) = p.Sign((const unsigned char*)x.c_str());
    if (suc) {
        std::cout << "\nsignature success";

        bool verified = Secp256K1::Verify((const uint8_t*)x.c_str(), res, p.publicKey());
        //        bool verified = p.Verify((const uint8_t*)x.c_str(), res);
        if (verified) {
            std::cout << "\nVerified!!!\n";
        }
    }
    return 0;
}